

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::setFixedPitch(QFont *this,bool enable)

{
  byte bVar1;
  QFontPrivate *pQVar2;
  byte in_SIL;
  long in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if (((*(uint *)(in_RDI + 8) & 0x200) == 0) ||
     (pQVar2 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712537),
     ((uint)((ulong)*(undefined8 *)&(pQVar2->request).field_0x60 >> 0x32) & 1) != (uint)(bVar1 & 1))
     ) {
    detach((QFont *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
    pQVar2 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712574);
    *(ulong *)&(pQVar2->request).field_0x60 =
         *(ulong *)&(pQVar2->request).field_0x60 & 0xfffbffffffffffff | (ulong)(bVar1 & 1) << 0x32;
    pQVar2 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7125a6);
    *(ulong *)&(pQVar2->request).field_0x60 =
         *(ulong *)&(pQVar2->request).field_0x60 & 0xfff7ffffffffffff;
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x200;
  }
  return;
}

Assistant:

void QFont::setFixedPitch(bool enable)
{
    if ((resolve_mask & QFont::FixedPitchResolved) && d->request.fixedPitch == enable)
        return;

    detach();

    d->request.fixedPitch = enable;
    d->request.ignorePitch = false;
    resolve_mask |= QFont::FixedPitchResolved;
}